

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_char,_3U> * __thiscall
ImageT<unsigned_char,_3U>::transformColorSpace
          (ImageT<unsigned_char,_3U> *this,TransferFunction *decode,TransferFunction *encode,
          ColorPrimaryTransform *transformPrimaries)

{
  Color *pCVar1;
  long lVar2;
  uint uVar3;
  float (*pafVar4) [3];
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined4 extraout_XMM0_Da;
  float fVar8;
  float extraout_XMM0_Da_00;
  float fVar9;
  float intensity [3];
  undefined8 local_78;
  undefined4 local_70;
  uint local_6c;
  ImageT<unsigned_char,_3U> *local_68;
  float (*local_60) [3];
  long local_58;
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  uVar3 = (this->super_Image).height * (this->super_Image).width;
  local_68 = this;
  if (uVar3 != 0) {
    local_50 = (ulong)uVar3;
    local_58 = 0;
    local_48 = 0;
    local_60 = (float (*) [3])transformPrimaries;
    do {
      pCVar1 = local_68->pixels;
      local_6c = (*(local_68->super_Image)._vptr_Image[5])();
      lVar2 = local_58;
      uVar5 = 3;
      if (local_6c < 3) {
        uVar5 = (ulong)local_6c;
      }
      if (local_6c != 0) {
        uVar7 = 0;
        do {
          (*decode->_vptr_TransferFunction[1])
                    ((ulong)(uint)((float)(pCVar1->field_0).comps[uVar7 + lVar2] * 0.003921569),
                     decode);
          *(undefined4 *)((long)&local_78 + uVar7 * 4) = extraout_XMM0_Da;
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      lVar2 = local_58;
      uVar3 = local_6c;
      if (local_60 != (float (*) [3])0x0) {
        local_40 = local_78;
        local_38 = local_70;
        if (local_6c != 0) {
          uVar7 = 0;
          pafVar4 = local_60;
          do {
            *(undefined4 *)((long)&local_78 + uVar7 * 4) = 0;
            fVar8 = 0.0;
            uVar6 = 0;
            do {
              fVar8 = fVar8 + (*(float (*) [3])*pafVar4)[uVar6] *
                              *(float *)((long)&local_40 + uVar6 * 4);
              uVar6 = uVar6 + 1;
            } while (uVar5 != uVar6);
            *(float *)((long)&local_78 + uVar7 * 4) = fVar8;
            uVar7 = uVar7 + 1;
            pafVar4 = pafVar4 + 1;
          } while (uVar7 != uVar5);
        }
      }
      if (uVar3 != 0) {
        uVar7 = 0;
        do {
          (**encode->_vptr_TransferFunction)((ulong)*(uint *)((long)&local_78 + uVar7 * 4),encode);
          fVar9 = roundf(extraout_XMM0_Da_00 * 255.0);
          fVar8 = 255.0;
          if (fVar9 <= 255.0) {
            fVar8 = fVar9;
          }
          (pCVar1->field_0).comps[uVar7 + lVar2] =
               (uchar)(int)(float)(~-(uint)(fVar9 < 0.0) & (uint)fVar8);
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
      }
      local_48 = local_48 + 1;
      local_58 = lVar2 + 3;
    } while (local_48 != local_50);
  }
  return local_68;
}

Assistant:

virtual ImageT& transformColorSpace(const TransferFunction& decode, const TransferFunction& encode,
                                        const ColorPrimaryTransform* transformPrimaries) override {
        uint32_t pixelCount = getPixelCount();
        for (uint32_t i = 0; i < pixelCount; ++i) {
            Color& c = pixels[i];
            // Don't transform the alpha component.
            uint32_t components = cclamp(getComponentCount(), 0u, 3u);
            float intensity[3];
            float brightness[3];

            // Decode source transfer function
            for (uint32_t comp = 0; comp < components; comp++) {
                brightness[comp] = (float)(c[comp]) * Color::rcpOne();
                intensity[comp] = decode.decode(brightness[comp]);
            }

            // If needed, transform primaries
            if (transformPrimaries != nullptr) {
                float origIntensity[3] = { intensity[0], intensity[1], intensity[2] };
                for (uint32_t j = 0; j < components; ++j) {
                    intensity[j] = 0.f;
                    for (uint32_t k = 0; k < components; ++k)
                        intensity[j] += transformPrimaries->matrix[j][k] * origIntensity[k];
                }
            }

            // Encode destination transfer function
            for (uint32_t comp = 0; comp < components; comp++) {
                brightness[comp] = encode.encode(intensity[comp]);
                // clamp(value, color::min, color::max) is required as static_cast has platform-specific behaviors
                // and on certain platforms can over or underflow
                c.set(comp, cclamp(
                        roundf(brightness[comp] * static_cast<float>(Color::one())),
                        static_cast<float>(Color::min()),
                        static_cast<float>(Color::max())));
            }
        }
        return *this;
    }